

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

int __thiscall Assimp::CFIReaderImpl::getAttributeValueAsInt(CFIReaderImpl *this,int idx)

{
  pointer pAVar1;
  element_type *peVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  iVar3 = 0;
  if ((-1 < idx) &&
     (pAVar1 = (this->attributes).
               super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
               ._M_impl.super__Vector_impl_data._M_start, iVar3 = 0,
     idx < (int)((ulong)((long)(this->attributes).
                               super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) >> 4) *
           0x38e38e39)) {
    peVar2 = pAVar1[(uint)idx].value.
             super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = __dynamic_cast(peVar2,&FIValue::typeinfo,&FIIntValue::typeinfo,0);
    }
    if (lVar4 == 0) {
      lVar4 = 0;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      this_00 = pAVar1[(uint)idx].value.
                super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
    }
    if (lVar4 == 0) {
      iVar3 = (**((this->attributes).
                  super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                  ._M_impl.super__Vector_impl_data._M_start[(uint)idx].value.
                  super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 _vptr_FIValue)();
      iVar3 = atoi(*(char **)CONCAT44(extraout_var,iVar3));
    }
    else {
      iVar3 = 0;
      if (*(long *)(lVar4 + 0x10) - (long)*(int **)(lVar4 + 8) == 4) {
        iVar3 = **(int **)(lVar4 + 8);
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  return iVar3;
}

Assistant:

virtual int getAttributeValueAsInt(int idx) const /*override*/ {
        if (idx < 0 || idx >= (int)attributes.size()) {
            return 0;
        }
        std::shared_ptr<const FIIntValue> intValue = std::dynamic_pointer_cast<const FIIntValue>(attributes[idx].value);
        if (intValue) {
            return intValue->value.size() == 1 ? intValue->value.front() : 0;
        }
        return atoi(attributes[idx].value->toString().c_str());
    }